

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O2

glyph_t * plutovg_font_face_get_glyph(plutovg_font_face_t *face,plutovg_codepoint_t codepoint)

{
  stbtt_fontinfo *info;
  int iVar1;
  uchar *puVar2;
  stbtt_uint32 sVar3;
  ushort uVar4;
  stbtt_uint32 sVar5;
  stbtt_uint32 sVar6;
  stbtt_uint32 sVar7;
  uint uVar8;
  glyph_t **ppgVar9;
  stbtt_vertex **pvertices;
  ulong uVar10;
  ushort uVar11;
  ushort *puVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ushort uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  stbtt_uint8 *p;
  bool bVar23;
  stbtt__csctx local_68;
  
  uVar16 = (ulong)(codepoint >> 8) & 0xff;
  ppgVar9 = face->glyphs[uVar16];
  if (ppgVar9 == (glyph_t **)0x0) {
    ppgVar9 = (glyph_t **)calloc(0x100,8);
    face->glyphs[uVar16] = ppgVar9;
  }
  if (ppgVar9[(ulong)codepoint & 0xff] != (glyph_t *)0x0) {
    return ppgVar9[(ulong)codepoint & 0xff];
  }
  pvertices = (stbtt_vertex **)malloc(0x28);
  puVar2 = (face->info).data;
  uVar8 = (face->info).index_map;
  uVar10 = (ulong)uVar8;
  uVar11 = *(ushort *)(puVar2 + uVar10) << 8;
  uVar4 = *(ushort *)(puVar2 + uVar10) >> 8;
  uVar19 = uVar11 | uVar4;
  switch(uVar19) {
  case 0:
    if ((int)codepoint <
        (int)((ushort)(*(ushort *)(puVar2 + uVar10 + 2) << 8 | *(ushort *)(puVar2 + uVar10 + 2) >> 8
                      ) - 6)) {
      uVar18 = (uint)puVar2[(long)(int)codepoint + uVar10 + 6];
    }
    else {
LAB_00104054:
      uVar18 = 0;
    }
    break;
  default:
    if ((uVar11 | uVar4 & 0xfffe) != 0xc) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                    ,0x631,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
    }
    sVar5 = ttULONG(puVar2 + uVar10 + 0xc);
    iVar15 = 0;
    while (sVar3 = sVar5, sVar3 - iVar15 != 0 && iVar15 <= (int)sVar3) {
      sVar5 = ((int)(sVar3 - iVar15) >> 1) + iVar15;
      p = puVar2 + (long)(int)(sVar5 * 0xc) + uVar10 + 0x10;
      sVar6 = ttULONG(p);
      if (sVar6 <= codepoint) {
        sVar7 = ttULONG(p + 4);
        if (codepoint <= sVar7) {
          sVar5 = ttULONG(p + 8);
          iVar15 = 0;
          if (uVar19 == 0xc) {
            iVar15 = codepoint - sVar6;
          }
          uVar18 = iVar15 + sVar5;
          goto LAB_00104210;
        }
        iVar15 = sVar5 + 1;
        sVar5 = sVar3;
      }
    }
    uVar18 = 0;
    break;
  case 2:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/sammycage[P]lunasvg/plutovg/source/plutovg-stb-truetype.h"
                  ,0x5ea,"int stbtt_FindGlyphIndex(const stbtt_fontinfo *, int)");
  case 4:
    if (0xffff < (int)codepoint) goto LAB_00104054;
    uVar11 = *(ushort *)(puVar2 + uVar10 + 6) << 8 | *(ushort *)(puVar2 + uVar10 + 6) >> 8;
    uVar4 = *(ushort *)(puVar2 + uVar10 + 10) << 8 | *(ushort *)(puVar2 + uVar10 + 10) >> 8;
    uVar18 = (uint)(ushort)(*(ushort *)(puVar2 + uVar10 + 8) << 8 |
                           *(ushort *)(puVar2 + uVar10 + 8) >> 8);
    uVar22 = (ulong)(puVar2[uVar10 + 0xd] & 0xfffffffe) | (ulong)puVar2[uVar10 + 0xc] << 8;
    if ((int)codepoint <
        (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar22 + (uVar8 + 0xe)) << 8 |
                           *(ushort *)(puVar2 + uVar22 + (uVar8 + 0xe)) >> 8)) {
      uVar22 = 0;
    }
    uVar17 = uVar8 + (int)uVar22 + 0xc;
    while (bVar23 = uVar4 != 0, uVar4 = uVar4 - 1, bVar23) {
      uVar18 = uVar18 >> 1;
      uVar21 = uVar18 & 0xfffffffe;
      if ((int)codepoint <=
          (int)(uint)(ushort)(*(ushort *)(puVar2 + (ulong)uVar21 + (ulong)uVar17) << 8 |
                             *(ushort *)(puVar2 + (ulong)uVar21 + (ulong)uVar17) >> 8)) {
        uVar21 = 0;
      }
      uVar17 = uVar21 + uVar17;
    }
    uVar22 = (ulong)((uVar17 - uVar8) + 0x1fff4 & 0x1fffe);
    uVar18 = 0;
    uVar17 = (uint)(ushort)(*(ushort *)(puVar2 + uVar22 + (uVar11 & 0xfffffffe) + uVar10 + 0x10) <<
                            8 | *(ushort *)(puVar2 + uVar22 + (uVar11 & 0xfffffffe) + uVar10 + 0x10)
                                >> 8);
    if (((int)uVar17 <= (int)codepoint) &&
       (uVar18 = 0,
       (int)codepoint <=
       (int)(uint)(ushort)(*(ushort *)(puVar2 + uVar22 + (uVar8 + 0xe)) << 8 |
                          *(ushort *)(puVar2 + uVar22 + (uVar8 + 0xe)) >> 8))) {
      uVar20 = (ulong)(uVar11 >> 1);
      lVar13 = uVar20 * 6;
      uVar11 = *(ushort *)(puVar2 + uVar22 + 2 + lVar13 + uVar10 + 0xe) << 8 |
               *(ushort *)(puVar2 + uVar22 + 2 + lVar13 + uVar10 + 0xe) >> 8;
      if (uVar11 == 0) {
        uVar18 = (ushort)(*(ushort *)(puVar2 + uVar22 + 2 + uVar20 * 4 + uVar10 + 0xe) << 8 |
                         *(ushort *)(puVar2 + uVar22 + 2 + uVar20 * 4 + uVar10 + 0xe) >> 8) +
                 codepoint;
      }
      else {
        uVar18 = (uint)(ushort)(*(ushort *)
                                 (puVar2 + uVar22 + 0x10 +
                                           uVar10 + lVar13 +
                                           (long)(int)((codepoint - uVar17) * 2) + (ulong)uVar11) <<
                                8 | *(ushort *)
                                     (puVar2 + uVar22 + 0x10 +
                                               uVar10 + lVar13 +
                                               (long)(int)((codepoint - uVar17) * 2) + (ulong)uVar11
                                     ) >> 8);
      }
    }
    uVar18 = uVar18 & 0xffff;
    break;
  case 6:
    uVar11 = *(ushort *)(puVar2 + uVar10 + 6) << 8 | *(ushort *)(puVar2 + uVar10 + 6) >> 8;
    uVar18 = 0;
    if ((uVar11 <= codepoint) &&
       (uVar18 = 0,
       codepoint <
       (uint)(ushort)(*(ushort *)(puVar2 + uVar10 + 8) << 8 | *(ushort *)(puVar2 + uVar10 + 8) >> 8)
       + (uint)uVar11)) {
      uVar18 = (uint)(ushort)(*(ushort *)(puVar2 + (ulong)((codepoint - uVar11) * 2) + uVar10 + 10)
                              << 8 | *(ushort *)
                                      (puVar2 + (ulong)((codepoint - uVar11) * 2) + uVar10 + 10) >>
                                     8);
    }
  }
LAB_00104210:
  info = &face->info;
  *(uint *)((long)pvertices + 0xc) = uVar18;
  iVar15 = stbtt_GetGlyphShape(info,uVar18,pvertices);
  *(int *)(pvertices + 1) = iVar15;
  iVar15 = *(int *)((long)pvertices + 0xc);
  puVar2 = (face->info).data;
  uVar11 = *(ushort *)(puVar2 + (long)(face->info).hhea + 0x22) << 8 |
           *(ushort *)(puVar2 + (long)(face->info).hhea + 0x22) >> 8;
  iVar1 = (face->info).hmtx;
  if (iVar15 < (int)(uint)uVar11) {
    puVar12 = (ushort *)((long)(puVar2 + (long)iVar15 * 4 + (long)iVar1) + 2);
    uVar11 = *(ushort *)(puVar2 + (long)iVar15 * 4 + (long)iVar1);
    uVar4 = uVar11 << 8 | uVar11 >> 8;
    lVar13 = (long)iVar15 * 4 + (long)iVar1 + 3;
  }
  else {
    lVar13 = (ulong)uVar11 * 4 + (long)iVar1;
    uVar4 = *(ushort *)(puVar2 + (ulong)uVar11 * 4 + (long)iVar1 + -4) << 8 |
            *(ushort *)(puVar2 + (ulong)uVar11 * 4 + (long)iVar1 + -4) >> 8;
    lVar14 = (long)(int)((iVar15 - (uint)uVar11) * 2);
    puVar12 = (ushort *)(puVar2 + lVar14 + lVar13);
    lVar13 = lVar14 + lVar13 + 1;
  }
  *(int *)(pvertices + 2) = (int)(short)uVar4;
  *(uint *)((long)pvertices + 0x14) =
       (int)(short)((ushort)(byte)*puVar12 << 8) | (uint)puVar2[lVar13];
  if ((face->info).cff.size == 0) {
    uVar8 = stbtt__GetGlyfOffset(info,iVar15);
    if (-1 < (int)uVar8) {
      puVar2 = (face->info).data;
      *(uint *)(pvertices + 3) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 2] << 8) | (uint)puVar2[(ulong)uVar8 + 3];
      *(uint *)((long)pvertices + 0x1c) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 4] << 8) | (uint)puVar2[(ulong)uVar8 + 5];
      *(uint *)(pvertices + 4) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 6] << 8) | (uint)puVar2[(ulong)uVar8 + 7];
      *(uint *)((long)pvertices + 0x24) =
           (int)(short)((ushort)puVar2[(ulong)uVar8 + 8] << 8) | (uint)puVar2[(ulong)uVar8 + 9];
      goto LAB_00104377;
    }
    uVar8 = 0;
    uVar18 = 0;
    uVar17 = 0;
    uVar21 = 0;
  }
  else {
    local_68.first_x = 0.0;
    local_68.first_y = 0.0;
    local_68.min_y = 0;
    local_68.max_y = 0;
    local_68.pvertices = (stbtt_vertex *)0x0;
    local_68.x = 0.0;
    local_68.y = 0.0;
    local_68.min_x = 0;
    local_68.max_x = 0;
    local_68.num_vertices = 0;
    local_68._52_4_ = 0;
    local_68.bounds = 1;
    local_68.started = 0;
    iVar15 = stbtt__run_charstring(info,iVar15,&local_68);
    uVar21 = (uint)(iVar15 == 0);
    uVar8 = ~((int)(uVar21 << 0x1f) >> 0x1f) & local_68.min_x;
    uVar17 = ~((int)(uVar21 << 0x1f) >> 0x1f) & local_68.max_x;
    uVar18 = ~((int)(uVar21 << 0x1f) >> 0x1f) & local_68.min_y;
    uVar21 = ~((int)(uVar21 << 0x1f) >> 0x1f) & local_68.max_y;
  }
  *(uint *)(pvertices + 3) = uVar8;
  *(uint *)((long)pvertices + 0x1c) = uVar18;
  *(uint *)(pvertices + 4) = uVar17;
  *(uint *)((long)pvertices + 0x24) = uVar21;
LAB_00104377:
  uVar10 = (ulong)(uint)((int)((ulong)codepoint & 0xff) << 3);
  *(stbtt_vertex ***)((long)face->glyphs[uVar16] + uVar10) = pvertices;
  return *(glyph_t **)((long)face->glyphs[uVar16] + uVar10);
}

Assistant:

static glyph_t* plutovg_font_face_get_glyph(plutovg_font_face_t* face, plutovg_codepoint_t codepoint)
{
    unsigned int msb = (codepoint >> 8) & 0xFF;
    if(face->glyphs[msb] == NULL) {
        face->glyphs[msb] = calloc(GLYPH_CACHE_SIZE, sizeof(glyph_t*));
    }

    unsigned int lsb = codepoint & 0xFF;
    if(face->glyphs[msb][lsb] == NULL) {
        glyph_t* glyph = malloc(sizeof(glyph_t));
        glyph->index = stbtt_FindGlyphIndex(&face->info, codepoint);
        glyph->nvertices = stbtt_GetGlyphShape(&face->info, glyph->index, &glyph->vertices);
        stbtt_GetGlyphHMetrics(&face->info, glyph->index, &glyph->advance_width, &glyph->left_side_bearing);
        if(!stbtt_GetGlyphBox(&face->info, glyph->index, &glyph->x1, &glyph->y1, &glyph->x2, &glyph->y2))
            glyph->x1 = glyph->y1 = glyph->x2 = glyph->y2 = 0;
        face->glyphs[msb][lsb] = glyph;
    }

    return face->glyphs[msb][lsb];
}